

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_defs.h
# Opt level: O3

FUDMFKey * __thiscall FUDMFKey::operator=(FUDMFKey *this,FString *val)

{
  long lVar1;
  double dVar2;
  
  this->Type = 2;
  lVar1 = strtol(val->Chars,(char **)0x0,0);
  this->IntVal = (int)lVar1;
  dVar2 = strtod(val->Chars,(char **)0x0);
  this->FloatVal = dVar2;
  FString::operator=(&this->StringVal,val);
  return this;
}

Assistant:

FUDMFKey& operator =(const FString &val)
	{
		Type = UDMF_String;
		IntVal = strtol(val.GetChars(), NULL, 0);
		FloatVal = strtod(val.GetChars(), NULL);
		StringVal = val;
		return *this;
	}